

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

vector<char_*,_std::allocator<char_*>_> *
absl::ParseCommandLine
          (vector<char_*,_std::allocator<char_*>_> *__return_storage_ptr__,int argc,char **argv)

{
  value_type *__x;
  value_type pcVar1;
  long lVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>_>
  *this;
  const_iterator cVar3;
  ostream *poVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *programname;
  char *extraout_RDX_02;
  char *programname_00;
  int i;
  int iVar5;
  value_type __s;
  int iVar6;
  string value;
  string key;
  string arg;
  string local_50 [32];
  
  if (argc == 0) {
    (__return_storage_ptr__->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  key.field_2._M_local_buf[0] = '\0';
  value.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<char_*,_std::allocator<char_*>_>::reserve(__return_storage_ptr__,(long)argc);
  std::vector<char_*,_std::allocator<char_*>_>::push_back(__return_storage_ptr__,argv);
  programname_00 = extraout_RDX;
  for (iVar5 = 1; iVar5 < argc; iVar5 = iVar5 + iVar6) {
    key._M_string_length = 0;
    __x = argv + iVar5;
    *key._M_dataplus._M_p = '\0';
    value._M_string_length = 0;
    *value._M_dataplus._M_p = '\0';
    pcVar1 = *__x;
    if (*pcVar1 == '-') {
      __s = pcVar1 + 1;
      if (pcVar1[1] == '-') {
        __s = pcVar1 + 2;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&arg,__s,(allocator<char> *)local_50);
      lVar2 = std::__cxx11::string::find((char *)&arg,0x36fda3);
      if (lVar2 == -1) {
        std::__cxx11::string::_M_assign((string *)&key);
        value._M_string_length = 0;
        *value._M_dataplus._M_p = '\0';
        iVar6 = 1;
        if ((argc - iVar5 != 1) && (*__x[1] != '-')) {
          std::__cxx11::string::assign((char *)&value);
          iVar6 = 2;
        }
      }
      else {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&arg);
        std::__cxx11::string::operator=((string *)&key,local_50);
        std::__cxx11::string::~string(local_50);
        std::__cxx11::string::substr((ulong)local_50,(ulong)&arg);
        std::__cxx11::string::operator=((string *)&value,local_50);
        std::__cxx11::string::~string(local_50);
        iVar6 = 1;
      }
      std::__cxx11::string::~string((string *)&arg);
      this = &internal::(anonymous_namespace)::GetFlagMap_abi_cxx11_()->_M_t;
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>_>
              ::find(this,&key);
      if ((_Rb_tree_header *)cVar3._M_node == &(this->_M_impl).super__Rb_tree_header) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Unknown/Invalid flag ");
        poVar4 = std::operator<<(poVar4,(string *)&key);
        poVar4 = std::operator<<(poVar4,"\n\n");
        internal::(anonymous_namespace)::PrintHelp_abi_cxx11_
                  (&arg,(_anonymous_namespace_ *)*argv,programname);
        std::operator<<(poVar4,(string *)&arg);
        std::__cxx11::string::~string((string *)&arg);
        sentencepiece::error::Exit(1);
        programname_00 = extraout_RDX_02;
      }
      else {
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)(*(long *)(cVar3._M_node + 2) + 0x38),&value);
        programname_00 = extraout_RDX_01;
      }
    }
    else {
      std::vector<char_*,_std::allocator<char_*>_>::push_back(__return_storage_ptr__,__x);
      iVar6 = 1;
      programname_00 = extraout_RDX_00;
    }
  }
  if (FLAGS_help.value_ == false) {
    if (FLAGS_version.value_ != true) goto LAB_0020808a;
    poVar4 = std::operator<<((ostream *)&std::cout,"sentencepiece");
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0.2.1");
    iVar5 = 0;
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    internal::(anonymous_namespace)::PrintHelp_abi_cxx11_
              (&arg,(_anonymous_namespace_ *)*argv,programname_00);
    std::operator<<((ostream *)&std::cout,(string *)&arg);
    std::__cxx11::string::~string((string *)&arg);
    iVar5 = 1;
  }
  sentencepiece::error::Exit(iVar5);
LAB_0020808a:
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)&key);
  return __return_storage_ptr__;
}

Assistant:

std::vector<char *> ParseCommandLine(int argc, char *argv[]) {
  if (argc == 0) return {};

  int used_argc = 0;
  std::string key, value;
  std::vector<char *> output_args;
  output_args.reserve(argc);
  output_args.push_back(argv[0]);

  auto set_flag = [](const std::string &name, const std::string &value) {
    const auto *flag_map = internal::GetFlagMap();
    auto it = flag_map->find(name);
    if (it == flag_map->end()) return false;
    it->second->set_value(value);
    return true;
  };

  for (int i = 1; i < argc; i += used_argc) {
    if (!internal::CommandLineGetFlag(argc - i, argv + i, &key, &value,
                                      &used_argc)) {
      output_args.push_back(argv[i]);
      continue;
    }

    if (!set_flag(key, value)) {
      std::cerr << "Unknown/Invalid flag " << key << "\n\n"
                << internal::PrintHelp(argv[0]);
      sentencepiece::error::Exit(1);
    }
  }

  if (absl::GetFlag(FLAGS_help)) {
    std::cout << internal::PrintHelp(argv[0]);
    sentencepiece::error::Exit(1);
  } else if (absl::GetFlag(FLAGS_version)) {
    std::cout << PACKAGE_STRING << " " << VERSION << std::endl;
    sentencepiece::error::Exit(0);
  }

  return output_args;
}